

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O2

void __thiscall
compiler::CompilerAstWalker::visitIfStatementAstNode
          (CompilerAstWalker *this,IfStatementAstNode *node)

{
  element_type *peVar1;
  unsigned_long local_20;
  
  (*(this->super_AstWalker)._vptr_AstWalker[0x16])();
  (*(this->super_AstWalker)._vptr_AstWalker[3])
            (this,(node->expression).
                  super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  peVar1 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_20 = (long)(peVar1->byteCode).
                   super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(peVar1->byteCode).
                   super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 4;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&peVar1->ifConditionEvalJumpIndices,&local_20);
  emit(this,JumpIfFalse);
  (*(this->super_AstWalker)._vptr_AstWalker[2])
            (this,(node->ifStatement).
                  super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if ((node->elseStatement).super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
      _M_payload.super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_engaged == true) {
    emit(this,Jump);
    peVar1 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_20 = (long)(peVar1->byteCode).
                     super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(peVar1->byteCode).
                     super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 4;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (&peVar1->elseStatementStartIndex,&local_20);
    (*(this->super_AstWalker)._vptr_AstWalker[2])
              (this,(node->elseStatement).
                    super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload
                    .super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                    super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload.
                    _M_value.super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              );
  }
  (*(this->super_AstWalker)._vptr_AstWalker[0x25])(this,node);
  return;
}

Assistant:

void visitIfStatementAstNode(IfStatementAstNode* node) noexcept override {
    this->onEnterIfStatementAstNode(node);
    this->visitExpressionAstNode(node->expression.get());
    this->ec->ifConditionEvalJumpIndices.push_back(this->ec->byteCode.size());
    this->emit(bytecode::ByteCodeInstruction::JumpIfFalse);
    this->visitStatementAstNode(node->ifStatement.get());
    if (node->elseStatement) {
      this->emit(bytecode::ByteCodeInstruction::Jump);
      this->ec->elseStatementStartIndex.push_back(this->ec->byteCode.size());
      this->visitStatementAstNode(node->elseStatement->get());
    }
    this->onExitIfStatementAstNode(node);
  }